

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ushort uVar1;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  undefined8 unaff_RBX;
  int iVar26;
  ulong uVar27;
  int16_t iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  short sVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  short sVar53;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 local_1e8 [16];
  int16_t *local_1d8;
  short local_188;
  short sStack_186;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  long local_d0;
  int *local_c8;
  ulong local_c0;
  ulong local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_sse2_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_sse2_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_sse2_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_sse2_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_table_diag_sse2_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_table_diag_sse2_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_table_diag_sse2_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar18 = matrix->min;
    iVar22 = -iVar18;
    if (iVar18 != -open && SBORROW4(iVar18,-open) == iVar18 + open < 0) {
      iVar22 = open;
    }
    uVar29 = iVar22 - 0x7fff;
    iVar18 = matrix->max;
    auVar37 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
    uVar36 = auVar37._0_4_;
    local_e8._4_4_ = uVar36;
    local_e8._0_4_ = uVar36;
    local_e8._8_4_ = uVar36;
    local_e8._12_4_ = uVar36;
    local_128._4_4_ = uVar36;
    local_128._0_4_ = uVar36;
    local_128._8_4_ = uVar36;
    local_128._12_4_ = uVar36;
    local_188 = auVar37._0_2_;
    sStack_186 = auVar37._2_2_;
    local_138._4_4_ = uVar36;
    local_138._0_4_ = uVar36;
    local_138._8_4_ = uVar36;
    local_138._12_4_ = uVar36;
    ppVar19 = parasail_result_new_table1(_s1Len,s2Len);
    if (ppVar19 != (parasail_result_t *)0x0) {
      ppVar19->flag = ppVar19->flag | 0x8221004;
      uVar23 = (ulong)(s2Len + 0xe);
      ptr = parasail_memalign_int16_t(0x10,uVar23);
      ptr_00 = parasail_memalign_int16_t(0x10,uVar23);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar23);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
        if (matrix->type == 0) {
          iVar22 = _s1Len + 7;
          local_1d8 = parasail_memalign_int16_t(0x10,(long)iVar22);
          if (local_1d8 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar6 = matrix->mapper;
            uVar23 = 0;
            do {
              local_1d8[uVar23] = (int16_t)piVar6[(byte)_s1[uVar23]];
              uVar23 = uVar23 + 1;
            } while ((uint)_s1Len != uVar23);
          }
          iVar17 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < iVar22) {
            iVar17 = iVar22;
          }
          memset(local_1d8 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar17) * 2 + 2);
        }
        else {
          local_1d8 = (int16_t *)0x0;
        }
        uVar34 = s2Len + 7;
        auVar37 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar18));
        auVar37 = pshuflw(auVar37,auVar37,0);
        local_118 = auVar37._0_2_;
        sStack_116 = auVar37._2_2_;
        uStack_7c = uVar36 & 0xffff;
        auVar37 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
        local_58 = auVar37._0_4_;
        auVar37 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
        local_68 = auVar37._0_4_;
        auVar37 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
        local_98 = auVar37._0_4_;
        auVar37 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        local_78 = auVar37._0_4_;
        piVar6 = matrix->mapper;
        uVar35 = (ulong)(uint)s2Len;
        uVar23 = 0;
        do {
          ptr[uVar23 + 7] = (int16_t)piVar6[(byte)_s2[uVar23]];
          uVar23 = uVar23 + 1;
        } while (uVar35 != uVar23);
        uVar23 = 0;
        ptr[3] = 0;
        ptr[4] = 0;
        ptr[5] = 0;
        ptr[6] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        ptr[2] = 0;
        ptr[3] = 0;
        uVar15 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar34) {
          uVar15 = uVar34;
        }
        sStack_114 = local_118;
        sStack_112 = sStack_116;
        sStack_110 = local_118;
        sStack_10e = sStack_116;
        sStack_10c = local_118;
        sStack_10a = sStack_116;
        uStack_94 = local_98;
        uStack_90 = local_98;
        uStack_8c = local_98;
        local_88 = uVar36;
        uStack_84 = uVar36;
        uStack_80 = uVar36;
        uStack_74 = local_78;
        uStack_70 = local_78;
        uStack_6c = local_78;
        uStack_64 = local_68;
        uStack_60 = local_68;
        uStack_5c = local_68;
        uStack_54 = local_58;
        uStack_50 = local_58;
        uStack_4c = local_58;
        memset(ptr + uVar35 + 7,0,(ulong)(~s2Len + uVar15) * 2 + 2);
        do {
          ptr_00[uVar23 + 7] = 0;
          iVar28 = (int16_t)uVar29;
          ptr_01[uVar23 + 7] = iVar28;
          uVar23 = uVar23 + 1;
        } while (uVar35 != uVar23);
        lVar20 = 0;
        do {
          ptr_00[lVar20] = iVar28;
          ptr_01[lVar20] = iVar28;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 7);
        lVar20 = uVar35 + 7;
        do {
          ptr_00[lVar20] = iVar28;
          ptr_01[lVar20] = iVar28;
          lVar20 = lVar20 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar34);
        if (_s1Len < 1) {
          auVar37._4_2_ = local_188;
          auVar37._0_4_ = uVar36;
          auVar37._6_2_ = sStack_186;
          auVar37._8_2_ = local_188;
          auVar37._10_2_ = sStack_186;
          auVar37._12_2_ = local_188;
          auVar37._14_2_ = sStack_186;
          local_128 = auVar37;
          sVar44 = local_118;
          sVar53 = sStack_116;
          sVar55 = sStack_114;
          sVar56 = sStack_112;
          sVar57 = sStack_110;
          sVar58 = sStack_10e;
          sVar59 = sStack_10c;
          sVar60 = sStack_10a;
        }
        else {
          local_c8 = matrix->matrix;
          uVar15 = _s1Len - 1;
          local_b8 = 1;
          if (1 < (int)uVar34) {
            local_b8 = (ulong)uVar34;
          }
          uVar27 = (ulong)(uint)_s1Len;
          local_140 = uVar35 * 0x1c + -0x1c;
          local_d0 = uVar35 * 0x20;
          local_148 = uVar35 * 4 + -4;
          local_158 = uVar35 * 0x18 + -0x18;
          local_160 = uVar35 * 0x14 + -0x14;
          local_168 = uVar35 * 8 + -8;
          local_170 = uVar35 * 0x10 + -0x10;
          local_178 = uVar35 * 0xc + -0xc;
          local_1e8._8_8_ = 0x100020003;
          local_1e8._0_8_ = 0x4000500060007;
          local_150 = 0;
          uVar23 = 0;
          local_108 = CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(sStack_116,local_118)));
          uStack_100 = CONCAT26(sStack_10a,CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110)));
          local_128._4_2_ = local_188;
          local_128._6_2_ = sStack_186;
          local_128._8_2_ = local_188;
          local_128._10_2_ = sStack_186;
          local_128._12_2_ = local_188;
          local_128._14_2_ = sStack_186;
          local_f8 = local_128;
          do {
            if (matrix->type == 0) {
              uVar34 = (uint)local_1d8[uVar23];
              uVar21 = (uint)local_1d8[uVar23 + 1];
              uVar16 = (uint)local_1d8[uVar23 + 2];
              uVar30 = (uint)local_1d8[uVar23 + 3];
              uVar25 = (uint)local_1d8[uVar23 + 4];
              uVar32 = (uint)local_1d8[uVar23 + 5];
              uVar31 = (uint)local_1d8[uVar23 + 6];
              uVar33 = (int)local_1d8[uVar23 + 7];
            }
            else {
              uVar34 = (uint)uVar23;
              uVar21 = uVar34 | 1;
              if (uVar27 <= (uVar23 | 1)) {
                uVar21 = uVar15;
              }
              uVar16 = uVar34 | 2;
              if (uVar27 <= (uVar23 | 2)) {
                uVar16 = uVar15;
              }
              uVar30 = uVar34 | 3;
              if (uVar27 <= (uVar23 | 3)) {
                uVar30 = uVar15;
              }
              uVar25 = uVar34 | 4;
              if (uVar27 <= (uVar23 | 4)) {
                uVar25 = uVar15;
              }
              uVar32 = uVar34 | 5;
              if (uVar27 <= (uVar23 | 5)) {
                uVar32 = uVar15;
              }
              uVar31 = uVar34 | 6;
              if (uVar27 <= (uVar23 | 6)) {
                uVar31 = uVar15;
              }
              uVar33 = uVar34 | 7;
              if (uVar27 <= (uVar23 | 7)) {
                uVar33 = uVar15;
              }
            }
            iVar18 = matrix->size;
            local_a0 = local_c8 + (int)(uVar25 * iVar18);
            local_a8 = local_c8 + (int)(uVar31 * iVar18);
            local_b0 = local_c8 + (int)(uVar33 * iVar18);
            local_c0 = uVar23;
            local_48 = -(ushort)((short)local_1e8._0_2_ < (short)local_98);
            sStack_46 = -(ushort)((short)local_1e8._2_2_ < local_98._2_2_);
            sStack_44 = -(ushort)((short)local_1e8._4_2_ < (short)uStack_94);
            sStack_42 = -(ushort)((short)local_1e8._6_2_ < uStack_94._2_2_);
            sStack_40 = -(ushort)((short)local_1e8._8_2_ < (short)uStack_90);
            sStack_3e = -(ushort)((short)local_1e8._10_2_ < uStack_90._2_2_);
            sStack_3c = -(ushort)((short)local_1e8._12_2_ < (short)uStack_8c);
            sStack_3a = -(ushort)((short)local_1e8._14_2_ < uStack_8c._2_2_);
            auVar38._4_2_ = local_188;
            auVar38._0_4_ = uVar36;
            auVar38._6_2_ = sStack_186;
            auVar38._8_2_ = local_188;
            auVar38._10_2_ = sStack_186;
            auVar38._12_2_ = local_188;
            auVar38._14_2_ = sStack_186;
            auVar69._4_4_ = uStack_84;
            auVar69._0_4_ = local_88;
            auVar69._8_4_ = uStack_80;
            auVar69._12_4_ = uStack_7c;
            uVar24 = 0;
            auVar37 = _DAT_00904d00;
            auVar65 = auVar69;
            auVar54 = auVar38;
            do {
              auVar67._14_2_ = (short)local_c8[(long)(int)(uVar34 * iVar18) + (long)ptr[uVar24 + 7]]
              ;
              auVar67._12_2_ = (short)local_c8[(long)(int)(uVar21 * iVar18) + (long)ptr[uVar24 + 6]]
              ;
              auVar67._10_2_ = (short)local_c8[(long)(int)(uVar16 * iVar18) + (long)ptr[uVar24 + 5]]
              ;
              auVar67._8_2_ = (short)local_c8[(long)(int)(uVar30 * iVar18) + (long)ptr[uVar24 + 4]];
              auVar67._6_2_ = (short)(local_c8 + (int)(uVar25 * iVar18))[ptr[uVar24 + 3]];
              auVar67._4_2_ = (short)local_c8[(long)(int)(uVar32 * iVar18) + (long)ptr[uVar24 + 2]];
              auVar67._0_2_ = (undefined2)(local_c8 + (int)(uVar33 * iVar18))[ptr[uVar24]];
              auVar67._2_2_ = (short)(local_c8 + (int)(uVar31 * iVar18))[ptr[uVar24 + 1]];
              auVar68._0_8_ = auVar69._2_8_;
              auVar68._8_8_ = auVar69._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar24 + 7] << 0x30;
              auVar67 = paddsw(auVar67,auVar65);
              auVar62._0_8_ = auVar38._2_8_;
              auVar62._8_8_ = auVar38._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar24 + 7] << 0x30;
              auVar66._4_4_ = uStack_54;
              auVar66._0_4_ = local_58;
              auVar66._8_4_ = uStack_50;
              auVar66._12_4_ = uStack_4c;
              auVar38 = psubsw(auVar68,auVar66);
              auVar65._4_4_ = uStack_64;
              auVar65._0_4_ = local_68;
              auVar65._8_4_ = uStack_60;
              auVar65._12_4_ = uStack_5c;
              auVar63 = psubsw(auVar62,auVar65);
              sVar44 = auVar38._0_2_;
              sVar53 = auVar63._0_2_;
              auVar64._0_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._2_2_;
              sVar53 = auVar63._2_2_;
              auVar64._2_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._4_2_;
              sVar53 = auVar63._4_2_;
              auVar64._4_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._6_2_;
              sVar53 = auVar63._6_2_;
              auVar64._6_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._8_2_;
              sVar53 = auVar63._8_2_;
              auVar64._8_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._10_2_;
              sVar53 = auVar63._10_2_;
              auVar64._10_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._12_2_;
              sVar53 = auVar63._12_2_;
              sVar55 = auVar63._14_2_;
              auVar64._12_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._14_2_;
              auVar64._14_2_ =
                   (ushort)(sVar55 < sVar44) * sVar44 | (ushort)(sVar55 >= sVar44) * sVar55;
              auVar38 = psubsw(auVar69,auVar66);
              auVar69 = psubsw(auVar54,auVar65);
              sVar44 = auVar38._0_2_;
              sVar53 = auVar69._0_2_;
              auVar70._0_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._2_2_;
              sVar53 = auVar69._2_2_;
              auVar70._2_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._4_2_;
              sVar53 = auVar69._4_2_;
              auVar70._4_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._6_2_;
              sVar53 = auVar69._6_2_;
              auVar70._6_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._8_2_;
              sVar53 = auVar69._8_2_;
              auVar70._8_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._10_2_;
              sVar53 = auVar69._10_2_;
              auVar70._10_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._12_2_;
              sVar53 = auVar69._12_2_;
              sVar55 = auVar69._14_2_;
              auVar70._12_2_ =
                   (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
              sVar44 = auVar38._14_2_;
              auVar70._14_2_ =
                   (ushort)(sVar55 < sVar44) * sVar44 | (ushort)(sVar55 >= sVar44) * sVar55;
              uVar45 = ((short)auVar70._0_2_ < (short)auVar64._0_2_) * auVar64._0_2_ |
                       ((short)auVar70._0_2_ >= (short)auVar64._0_2_) * auVar70._0_2_;
              uVar46 = ((short)auVar70._2_2_ < (short)auVar64._2_2_) * auVar64._2_2_ |
                       ((short)auVar70._2_2_ >= (short)auVar64._2_2_) * auVar70._2_2_;
              uVar47 = ((short)auVar70._4_2_ < (short)auVar64._4_2_) * auVar64._4_2_ |
                       ((short)auVar70._4_2_ >= (short)auVar64._4_2_) * auVar70._4_2_;
              uVar48 = ((short)auVar70._6_2_ < (short)auVar64._6_2_) * auVar64._6_2_ |
                       ((short)auVar70._6_2_ >= (short)auVar64._6_2_) * auVar70._6_2_;
              uVar49 = ((short)auVar70._8_2_ < (short)auVar64._8_2_) * auVar64._8_2_ |
                       ((short)auVar70._8_2_ >= (short)auVar64._8_2_) * auVar70._8_2_;
              uVar50 = ((short)auVar70._10_2_ < (short)auVar64._10_2_) * auVar64._10_2_ |
                       ((short)auVar70._10_2_ >= (short)auVar64._10_2_) * auVar70._10_2_;
              uVar51 = ((short)auVar70._12_2_ < (short)auVar64._12_2_) * auVar64._12_2_ |
                       ((short)auVar70._12_2_ >= (short)auVar64._12_2_) * auVar70._12_2_;
              uVar52 = ((short)auVar70._14_2_ < (short)auVar64._14_2_) * auVar64._14_2_ |
                       ((short)auVar70._14_2_ >= (short)auVar64._14_2_) * auVar70._14_2_;
              sVar53 = (-1 < (short)uVar45) * uVar45;
              sVar44 = (-1 < (short)uVar46) * uVar46;
              sVar55 = (-1 < (short)uVar47) * uVar47;
              sVar56 = (-1 < (short)uVar48) * uVar48;
              sVar57 = (-1 < (short)uVar49) * uVar49;
              sVar58 = (-1 < (short)uVar50) * uVar50;
              sVar59 = (-1 < (short)uVar51) * uVar51;
              sVar60 = (-1 < (short)uVar52) * uVar52;
              sVar61 = auVar67._0_2_;
              auVar63._0_2_ =
                   (ushort)(sVar53 < sVar61) * sVar61 | (ushort)(sVar53 >= sVar61) * sVar53;
              sVar53 = auVar67._2_2_;
              auVar63._2_2_ =
                   (ushort)(sVar44 < sVar53) * sVar53 | (ushort)(sVar44 >= sVar53) * sVar44;
              sVar44 = auVar67._4_2_;
              auVar63._4_2_ =
                   (ushort)(sVar55 < sVar44) * sVar44 | (ushort)(sVar55 >= sVar44) * sVar55;
              sVar44 = auVar67._6_2_;
              auVar63._6_2_ =
                   (ushort)(sVar56 < sVar44) * sVar44 | (ushort)(sVar56 >= sVar44) * sVar56;
              sVar44 = auVar67._8_2_;
              auVar63._8_2_ =
                   (ushort)(sVar57 < sVar44) * sVar44 | (ushort)(sVar57 >= sVar44) * sVar57;
              sVar44 = auVar67._10_2_;
              auVar63._10_2_ =
                   (ushort)(sVar58 < sVar44) * sVar44 | (ushort)(sVar58 >= sVar44) * sVar58;
              sVar44 = auVar67._12_2_;
              auVar63._12_2_ =
                   (ushort)(sVar59 < sVar44) * sVar44 | (ushort)(sVar59 >= sVar44) * sVar59;
              sVar44 = auVar67._14_2_;
              auVar63._14_2_ =
                   (ushort)(sVar60 < sVar44) * sVar44 | (ushort)(sVar60 >= sVar44) * sVar60;
              sVar53 = auVar37._0_2_;
              auVar54._0_2_ = -(ushort)(sVar53 == -1);
              sVar55 = auVar37._2_2_;
              auVar54._2_2_ = -(ushort)(sVar55 == -1);
              sVar56 = auVar37._4_2_;
              auVar54._4_2_ = -(ushort)(sVar56 == -1);
              sVar57 = auVar37._6_2_;
              auVar54._6_2_ = -(ushort)(sVar57 == -1);
              sVar58 = auVar37._8_2_;
              auVar54._8_2_ = -(ushort)(sVar58 == -1);
              sVar59 = auVar37._10_2_;
              auVar54._10_2_ = -(ushort)(sVar59 == -1);
              sVar60 = auVar37._12_2_;
              sVar61 = auVar37._14_2_;
              auVar54._12_2_ = -(ushort)(sVar60 == -1);
              auVar54._14_2_ = -(ushort)(sVar61 == -1);
              auVar69 = ~auVar54 & auVar63;
              sVar44 = auVar69._0_2_;
              uVar45 = auVar69._2_2_;
              uVar51 = auVar69._14_2_;
              uVar48 = auVar69._8_2_;
              uVar49 = auVar69._10_2_;
              uVar50 = auVar69._12_2_;
              uVar46 = auVar69._4_2_;
              uVar47 = auVar69._6_2_;
              if (7 < uVar24) {
                bVar7 = sVar44 < (short)local_108;
                uVar1 = (ushort)!bVar7 * (short)local_108;
                bVar8 = (short)uVar45 < local_108._2_2_;
                uVar2 = (ushort)!bVar8 * local_108._2_2_;
                bVar9 = (short)uVar46 < local_108._4_2_;
                uVar3 = (ushort)!bVar9 * local_108._4_2_;
                bVar10 = (short)uVar48 < (short)uStack_100;
                uVar4 = (ushort)!bVar10 * (short)uStack_100;
                bVar11 = (short)uVar49 < uStack_100._2_2_;
                uVar5 = (ushort)!bVar11 * uStack_100._2_2_;
                bVar12 = (short)uVar50 < uStack_100._4_2_;
                uVar52 = (ushort)!bVar12 * uStack_100._4_2_;
                local_108 = CONCAT26(((short)uVar47 < local_108._6_2_) * uVar47 |
                                     (ushort)((short)uVar47 >= local_108._6_2_) * local_108._6_2_,
                                     CONCAT24(bVar9 * uVar46 | uVar3,
                                              CONCAT22(bVar8 * uVar45 | uVar2,
                                                       (ushort)bVar7 * sVar44 | uVar1)));
                uStack_100 = CONCAT26(((short)uVar51 < uStack_100._6_2_) * uVar51 |
                                      (ushort)((short)uVar51 >= uStack_100._6_2_) * uStack_100._6_2_
                                      ,CONCAT24(bVar12 * uVar50 | uVar52,
                                                CONCAT22(bVar11 * uVar49 | uVar5,
                                                         bVar10 * uVar48 | uVar4)));
                local_f8._2_2_ =
                     ((short)local_f8._2_2_ < (short)uVar45) * uVar45 |
                     (ushort)((short)local_f8._2_2_ >= (short)uVar45) * local_f8._2_2_;
                local_f8._0_2_ =
                     (ushort)((short)local_f8._0_2_ < sVar44) * sVar44 |
                     (ushort)((short)local_f8._0_2_ >= sVar44) * local_f8._0_2_;
                local_f8._4_2_ =
                     ((short)local_f8._4_2_ < (short)uVar46) * uVar46 |
                     (ushort)((short)local_f8._4_2_ >= (short)uVar46) * local_f8._4_2_;
                local_f8._6_2_ =
                     ((short)local_f8._6_2_ < (short)uVar47) * uVar47 |
                     (ushort)((short)local_f8._6_2_ >= (short)uVar47) * local_f8._6_2_;
                local_f8._8_2_ =
                     ((short)local_f8._8_2_ < (short)uVar48) * uVar48 |
                     (ushort)((short)local_f8._8_2_ >= (short)uVar48) * local_f8._8_2_;
                local_f8._10_2_ =
                     ((short)local_f8._10_2_ < (short)uVar49) * uVar49 |
                     (ushort)((short)local_f8._10_2_ >= (short)uVar49) * local_f8._10_2_;
                local_f8._12_2_ =
                     ((short)local_f8._12_2_ < (short)uVar50) * uVar50 |
                     (ushort)((short)local_f8._12_2_ >= (short)uVar50) * local_f8._12_2_;
                local_f8._14_2_ =
                     ((short)local_f8._14_2_ < (short)uVar51) * uVar51 |
                     (ushort)((short)local_f8._14_2_ >= (short)uVar51) * local_f8._14_2_;
              }
              piVar6 = ((ppVar19->field_4).rowcols)->score_row;
              if (uVar24 < uVar35) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_150) = (uint)uVar51;
              }
              if (uVar24 - 1 < uVar35 && (uVar23 | 1) < uVar27) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_148) = (uint)uVar50;
              }
              if (((uVar23 | 2) < uVar27) && ((long)(uVar24 - 2) < (long)uVar35 && 1 < uVar24)) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_168) = (uint)uVar49;
              }
              if (((uVar23 | 3) < uVar27) && ((long)(uVar24 - 3) < (long)uVar35 && 2 < uVar24)) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_178) = (uint)uVar48;
              }
              if (((uVar23 | 4) < uVar27) && ((long)(uVar24 - 4) < (long)uVar35 && 3 < uVar24)) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_170) = (uint)uVar47;
              }
              if (((uVar23 | 5) < uVar27) && ((long)(uVar24 - 5) < (long)uVar35 && 4 < uVar24)) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_160) = (uint)uVar46;
              }
              if (((uVar23 | 6) < uVar27) && ((long)(uVar24 - 6) < (long)uVar35 && 5 < uVar24)) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_158) = (uint)uVar45;
              }
              if (6 < uVar24 && (uVar23 | 7) < uVar27) {
                *(uint *)((long)piVar6 + uVar24 * 4 + local_140) = auVar69._0_4_ & 0xffff;
              }
              auVar13._4_2_ = local_188;
              auVar13._0_4_ = uVar36;
              auVar13._6_2_ = sStack_186;
              auVar13._8_2_ = local_188;
              auVar13._10_2_ = sStack_186;
              auVar13._12_2_ = local_188;
              auVar13._14_2_ = sStack_186;
              auVar38 = ~auVar54 & auVar64 | auVar13 & auVar54;
              auVar54 = ~auVar54 & auVar70 | auVar13 & auVar54;
              auVar39._0_2_ = -(ushort)(sVar53 < (short)local_78);
              auVar39._2_2_ = -(ushort)(sVar55 < local_78._2_2_);
              auVar39._4_2_ = -(ushort)(sVar56 < (short)uStack_74);
              auVar39._6_2_ = -(ushort)(sVar57 < uStack_74._2_2_);
              auVar39._8_2_ = -(ushort)(sVar58 < (short)uStack_70);
              auVar39._10_2_ = -(ushort)(sVar59 < uStack_70._2_2_);
              auVar39._12_2_ = -(ushort)(sVar60 < (short)uStack_6c);
              auVar39._14_2_ = -(ushort)(sVar61 < uStack_6c._2_2_);
              auVar14._2_2_ = -(ushort)((short)local_1e8._2_2_ < local_98._2_2_);
              auVar14._0_2_ = -(ushort)((short)local_1e8._0_2_ < (short)local_98);
              auVar14._4_2_ = -(ushort)((short)local_1e8._4_2_ < (short)uStack_94);
              auVar14._6_2_ = -(ushort)((short)local_1e8._6_2_ < uStack_94._2_2_);
              auVar14._8_2_ = -(ushort)((short)local_1e8._8_2_ < (short)uStack_90);
              auVar14._10_2_ = -(ushort)((short)local_1e8._10_2_ < uStack_90._2_2_);
              auVar14._12_2_ = -(ushort)((short)local_1e8._12_2_ < (short)uStack_8c);
              auVar14._14_2_ = -(ushort)((short)local_1e8._14_2_ < uStack_8c._2_2_);
              auVar65 = psraw(auVar37,0xf);
              auVar66 = ~auVar65 & auVar39 & auVar14;
              auVar40._0_2_ = -(ushort)(sVar44 == local_e8._0_2_);
              auVar40._2_2_ = -(ushort)(uVar45 == local_e8._2_2_);
              auVar40._4_2_ = -(ushort)(uVar46 == local_e8._4_2_);
              auVar40._6_2_ = -(ushort)(uVar47 == local_e8._6_2_);
              auVar40._8_2_ = -(ushort)(uVar48 == local_e8._8_2_);
              auVar40._10_2_ = -(ushort)(uVar49 == local_e8._10_2_);
              auVar40._12_2_ = -(ushort)(uVar50 == local_e8._12_2_);
              auVar40._14_2_ = -(ushort)(uVar51 == local_e8._14_2_);
              auVar42._0_2_ = -(ushort)(local_e8._0_2_ < sVar44);
              auVar42._2_2_ = -(ushort)((short)local_e8._2_2_ < (short)uVar45);
              auVar42._4_2_ = -(ushort)((short)local_e8._4_2_ < (short)uVar46);
              auVar42._6_2_ = -(ushort)((short)local_e8._6_2_ < (short)uVar47);
              auVar42._8_2_ = -(ushort)((short)local_e8._8_2_ < (short)uVar48);
              auVar42._10_2_ = -(ushort)((short)local_e8._10_2_ < (short)uVar49);
              auVar42._12_2_ = -(ushort)((short)local_e8._12_2_ < (short)uVar50);
              auVar42._14_2_ = -(ushort)((short)local_e8._14_2_ < (short)uVar51);
              auVar71._0_2_ = -(ushort)(sVar53 < local_138._0_2_);
              auVar71._2_2_ = -(ushort)(sVar55 < local_138._2_2_);
              auVar71._4_2_ = -(ushort)(sVar56 < local_138._4_2_);
              auVar71._6_2_ = -(ushort)(sVar57 < local_138._6_2_);
              auVar71._8_2_ = -(ushort)(sVar58 < local_138._8_2_);
              auVar71._10_2_ = -(ushort)(sVar59 < local_138._10_2_);
              auVar71._12_2_ = -(ushort)(sVar60 < local_138._12_2_);
              auVar71._14_2_ = -(ushort)(sVar61 < local_138._14_2_);
              auVar71 = auVar71 & auVar40;
              auVar65 = auVar42 & auVar66;
              local_e8 = auVar63 & auVar65 | ~auVar65 & local_e8;
              auVar65 = ~auVar71 & auVar65 | auVar66 & auVar71;
              local_128 = ~auVar65 & local_128 | local_1e8 & auVar65;
              auVar66 = (auVar71 | auVar42) & auVar66;
              local_138 = ~auVar66 & local_138 | auVar37 & auVar66;
              ptr_00[uVar24] = sVar44;
              ptr_01[uVar24] = auVar38._0_2_;
              auVar37 = paddsw(auVar37,_DAT_00904d10);
              uVar24 = uVar24 + 1;
              auVar65 = auVar68;
            } while (local_b8 != uVar24);
            local_1e8 = paddsw(local_1e8,_DAT_00904d20);
            uVar23 = uVar23 + 8;
            local_140 = local_140 + local_d0;
            local_150 = local_150 + local_d0;
            local_148 = local_148 + local_d0;
            local_158 = local_158 + local_d0;
            local_160 = local_160 + local_d0;
            local_170 = local_170 + local_d0;
            local_178 = local_178 + local_d0;
            local_168 = local_168 + local_d0;
          } while (uVar23 < uVar27);
          auVar37 = local_f8;
          sVar44 = (short)local_108;
          sVar53 = local_108._2_2_;
          sVar55 = local_108._4_2_;
          sVar56 = local_108._6_2_;
          sVar57 = (short)uStack_100;
          sVar58 = uStack_100._2_2_;
          sVar59 = uStack_100._4_2_;
          sVar60 = uStack_100._6_2_;
        }
        lVar20 = 0;
        iVar17 = 0;
        iVar18 = 0;
        iVar22 = 0;
        do {
          uVar45 = *(ushort *)(local_e8 + lVar20 * 2);
          if ((short)(ushort)uVar29 < (short)uVar45) {
            uVar29 = (uint)uVar45;
            iVar18 = (int)*(short *)(local_128 + lVar20 * 2);
            iVar22 = (int)*(short *)(local_138 + lVar20 * 2);
            iVar17 = (int)*(short *)(local_128 + lVar20 * 2);
          }
          else if (uVar45 == (ushort)uVar29) {
            iVar26 = (int)*(short *)(local_138 + lVar20 * 2);
            if (iVar26 < iVar22) {
              iVar18 = (int)*(short *)(local_128 + lVar20 * 2);
              iVar22 = iVar26;
              iVar17 = (int)*(short *)(local_128 + lVar20 * 2);
            }
            else if ((iVar22 == iVar26) &&
                    (iVar26 = (int)*(short *)(local_128 + lVar20 * 2), bVar7 = iVar26 <= iVar18,
                    iVar18 = iVar17, bVar7)) {
              iVar18 = iVar26;
              iVar17 = iVar26;
            }
          }
          sVar61 = (short)uVar29;
          lVar20 = lVar20 + 1;
        } while ((int)lVar20 != 8);
        auVar41._0_2_ = -(ushort)(sVar44 < local_188);
        auVar41._2_2_ = -(ushort)(sVar53 < sStack_186);
        auVar41._4_2_ = -(ushort)(sVar55 < local_188);
        auVar41._6_2_ = -(ushort)(sVar56 < sStack_186);
        auVar41._8_2_ = -(ushort)(sVar57 < local_188);
        auVar41._10_2_ = -(ushort)(sVar58 < sStack_186);
        auVar41._12_2_ = -(ushort)(sVar59 < local_188);
        auVar41._14_2_ = -(ushort)(sVar60 < sStack_186);
        auVar43._0_2_ = -(ushort)(local_118 < auVar37._0_2_);
        auVar43._2_2_ = -(ushort)(sStack_116 < auVar37._2_2_);
        auVar43._4_2_ = -(ushort)(sStack_114 < auVar37._4_2_);
        auVar43._6_2_ = -(ushort)(sStack_112 < auVar37._6_2_);
        auVar43._8_2_ = -(ushort)(sStack_110 < auVar37._8_2_);
        auVar43._10_2_ = -(ushort)(sStack_10e < auVar37._10_2_);
        auVar43._12_2_ = -(ushort)(sStack_10c < auVar37._12_2_);
        auVar43._14_2_ = -(ushort)(sStack_10a < auVar37._14_2_);
        auVar43 = auVar43 | auVar41;
        if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar43 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar43 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar43 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar43 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
          sVar61 = 0;
          iVar22 = 0;
          iVar18 = 0;
        }
        ppVar19->score = (int)sVar61;
        ppVar19->end_query = iVar18;
        ppVar19->end_ref = iVar22;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_1d8);
          return ppVar19;
        }
        return ppVar19;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}